

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          String *params_6,ArrayPtr<const_char> *params_7,ArrayPtr<const_char> *params_8,
          ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,String *params_12,ArrayPtr<const_char> *params_13,
          StringTree *params_14,StringTree *params_15,StringTree *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          ArrayPtr<const_char> *params_19,String *params_20,ArrayPtr<const_char> *params_21,
          String *params_22,ArrayPtr<const_char> *params_23,ArrayPtr<const_char> *params_24,
          ArrayPtr<const_char> *params_25,StringTree *params_26,ArrayPtr<const_char> *params_27)

{
  long lVar1;
  size_t sVar2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_150;
  StringTree *local_138;
  StringTree *local_130;
  ArrayPtr<const_char> *local_128;
  ArrayPtr<const_char> *local_120;
  StringTree *local_118;
  size_t local_110;
  char *local_108;
  size_t sStack_100;
  size_t local_f8;
  char *local_f0;
  char *local_e8;
  long local_e0;
  size_t local_d8;
  size_t sStack_d0;
  size_t local_c8;
  size_t sStack_c0;
  size_t local_b8;
  long local_b0;
  size_t local_a8;
  char *local_a0;
  size_t sStack_98;
  size_t local_90;
  char *local_88;
  size_t sStack_80;
  size_t local_78;
  long local_70;
  size_t local_68;
  long local_60;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_110 = this->size_;
  local_108 = (params->text).content.ptr;
  sStack_100 = params_1->size_;
  local_f8 = params_2->size_;
  local_f0 = params_3->ptr;
  local_e8 = (params_4->text).content.ptr;
  lVar1 = 0;
  local_e0 = params_5->size_ - 1;
  if (params_5->size_ == 0) {
    local_e0 = lVar1;
  }
  local_d8 = (params_6->content).size_;
  sStack_d0 = params_7->size_;
  local_c8 = params_8->size_;
  sStack_c0 = params_9->size_;
  local_b8 = params_10->size_;
  local_b0 = params_11->size_ - 1;
  if (params_11->size_ == 0) {
    local_b0 = lVar1;
  }
  local_a8 = (params_12->content).size_;
  local_a0 = params_13->ptr;
  sStack_98 = params_14->size_;
  local_90 = params_15->size_;
  local_88 = (params_16->text).content.ptr;
  sStack_80 = params_17->size_;
  local_78 = params_18->size_;
  local_70 = params_19->size_ - 1;
  if (params_19->size_ == 0) {
    local_70 = lVar1;
  }
  local_68 = (params_20->content).size_;
  local_60 = params_21->size_ - 1;
  if (params_21->size_ == 0) {
    local_60 = lVar1;
  }
  local_58 = (params_22->content).size_;
  sStack_50 = params_23->size_;
  local_48 = params_24->size_;
  local_40 = params_25->ptr;
  local_38 = (params_26->text).content.ptr;
  nums._M_len = (size_type)params_9;
  nums._M_array = (iterator)0x1c;
  local_138 = this;
  local_118 = (StringTree *)params_3;
  sVar2 = _::sum((_ *)&local_110,nums);
  __return_storage_ptr__->size_ = sVar2;
  local_110 = 0;
  local_108 = (params->text).content.ptr;
  sStack_100 = params_1->size_;
  local_f8 = params_2->size_;
  local_f0 = (char *)0x0;
  local_e8 = (params_4->text).content.ptr;
  local_e0 = 0;
  local_d8 = (params_6->content).size_;
  sStack_d0 = params_7->size_;
  local_c8 = params_8->size_;
  sStack_c0 = params_9->size_;
  local_b8 = params_10->size_;
  local_b0 = 0;
  local_a8 = (params_12->content).size_;
  local_a0 = (char *)0x0;
  sStack_98 = 0;
  local_90 = 0;
  local_88 = (params_16->text).content.ptr;
  sStack_80 = params_17->size_;
  local_78 = params_18->size_;
  local_70 = 0;
  local_68 = (params_20->content).size_;
  local_60 = 0;
  local_58 = (params_22->content).size_;
  sStack_50 = params_23->size_;
  local_48 = params_24->size_;
  local_40 = (char *)0x0;
  local_38 = (params_26->text).content.ptr;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x1c;
  local_130 = params;
  local_128 = params_1;
  local_120 = params_2;
  sVar2 = _::sum((_ *)&local_110,nums_00);
  heapString((String *)&local_150,sVar2);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_150);
  Array<char>::~Array((Array<char> *)&local_150);
  local_110 = 1;
  local_108 = (char *)0x0;
  sStack_100 = 0;
  local_f8 = 0;
  local_f0 = (char *)0x1;
  local_e8 = (char *)0x0;
  local_e0 = 1;
  local_d8 = 0;
  sStack_d0 = 0;
  local_c8 = 0;
  sStack_c0 = 0;
  local_b8 = 0;
  local_b0 = 1;
  local_a8 = 0;
  local_a0 = (char *)0x1;
  sStack_98 = 1;
  local_90 = 1;
  local_88 = (char *)0x0;
  sStack_80 = 0;
  local_78 = 0;
  local_70 = 1;
  local_68 = 0;
  local_60 = 1;
  local_58 = 0;
  sStack_50 = 0;
  local_48 = 0;
  local_40 = (char *)0x1;
  local_38 = (char *)0x0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x1c;
  sVar2 = _::sum((_ *)&local_110,nums_01);
  local_150.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar2);
  local_150.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_150.size_ = sVar2;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_150);
  Array<kj::StringTree::Branch>::~Array(&local_150);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_138,(ArrayPtr<const_char> *)local_130,local_128,
             local_120,local_118,(ArrayPtr<const_char> *)params_4,(String *)params_5,
             (ArrayPtr<const_char> *)params_6,params_7,params_8,params_9,params_10,
             (String *)params_11,(ArrayPtr<const_char> *)params_12,(StringTree *)params_13,params_14
             ,params_15,(ArrayPtr<const_char> *)params_16,params_17,params_18,(String *)params_19,
             (ArrayPtr<const_char> *)params_20,(String *)params_21,(ArrayPtr<const_char> *)params_22
             ,params_23,params_24,(StringTree *)params_25,(ArrayPtr<const_char> *)params_26);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}